

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *enumNode)

{
  ListElementCount LVar1;
  bool *__s;
  ulong uVar2;
  uint index;
  StringPtr name;
  Array<bool> sawCodeOrder_heap;
  Fault f;
  IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
  local_d8;
  Reader enumerant;
  Reader enumerants;
  ArrayPtr<const_char> local_68;
  bool sawCodeOrder_stack [32];
  
  capnp::schema::Node::Enum::Reader::getEnumerants(&enumerants,enumNode);
  uVar2 = (ulong)enumerants.reader.elementCount;
  if (uVar2 < 0x21) {
    sawCodeOrder_heap.ptr = (bool *)0x0;
    sawCodeOrder_heap.size_ = 0;
    sawCodeOrder_heap.disposer = (ArrayDisposer *)0x0;
    __s = sawCodeOrder_stack;
  }
  else {
    __s = kj::_::HeapArrayDisposer::allocate<bool>(uVar2);
    sawCodeOrder_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawCodeOrder_heap.ptr = __s;
    sawCodeOrder_heap.size_ = uVar2;
  }
  memset(__s,0,uVar2);
  LVar1 = enumerants.reader.elementCount;
  local_d8.index = 0;
  index = 0;
  local_d8.container = &enumerants;
  do {
    if (local_d8.index == LVar1) {
LAB_001a950c:
      kj::Array<bool>::~Array(&sawCodeOrder_heap);
      return;
    }
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
    ::operator*(&enumerant,&local_d8);
    name.content = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName(&enumerant);
    validateMemberName(this,name,index);
    if (enumerant._reader.dataSize < 0x10) {
      if ((enumerants.reader.elementCount == 0) || (*__s != false)) {
LAB_001a94b3:
        local_68 = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName(&enumerant);
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18],capnp::Text::Reader>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x1a2,FAILED,
                   "enumerant.getCodeOrder() < enumerants.size() && !sawCodeOrder[enumerant.getCodeOrder()]"
                   ,"\"invalid codeOrder\", enumerant.getName()",(char (*) [18])"invalid codeOrder",
                   (Reader *)&local_68);
        this->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        goto LAB_001a950c;
      }
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)*enumerant._reader.data;
      if ((enumerants.reader.elementCount <= *enumerant._reader.data) || (__s[uVar2] != false))
      goto LAB_001a94b3;
    }
    __s[uVar2] = true;
    local_d8.index = local_d8.index + 1;
    index = index + 1;
  } while( true );
}

Assistant:

KJ_STACK_ARRAY(bool, sawCodeOrder, enumerants.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto enumerant: enumerants) {
      validateMemberName(enumerant.getName(), index++);

      VALIDATE_SCHEMA(enumerant.getCodeOrder() < enumerants.size() &&
                      !sawCodeOrder[enumerant.getCodeOrder()],
                      "invalid codeOrder", enumerant.getName());
      sawCodeOrder[enumerant.getCodeOrder()] = true;
    }